

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.cpp
# Opt level: O3

OpenMPClause * OpenMPUsesAllocatorsClause::addUsesAllocatorsClause(OpenMPDirective *directive)

{
  iterator __position;
  undefined8 in_RAX;
  mapped_type *ppvVar1;
  vector<OpenMPClause*,std::allocator<OpenMPClause*>> *this;
  undefined8 local_18;
  
  local_18._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
  local_18._0_4_ = OMPC_uses_allocators;
  ppvVar1 = std::
            map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
            ::operator[](&directive->clauses,(key_type *)&local_18);
  this = (vector<OpenMPClause*,std::allocator<OpenMPClause*>> *)*ppvVar1;
  if (*(pointer *)(this + 8) == *(pointer *)this) {
    this = (vector<OpenMPClause*,std::allocator<OpenMPClause*>> *)operator_new(0x18);
    *(undefined8 *)this = 0;
    *(pointer *)(this + 8) = (pointer)0x0;
    *(pointer *)(this + 0x10) = (pointer)0x0;
    local_18._0_4_ = OMPC_uses_allocators;
    ppvVar1 = std::
              map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
              ::operator[](&directive->clauses,(key_type *)&local_18);
    *ppvVar1 = (mapped_type)this;
  }
  local_18 = (OpenMPClause *)operator_new(0x80);
  (local_18->super_SourceLocation).line = 0;
  (local_18->super_SourceLocation).column = 0;
  (local_18->super_SourceLocation).parent_construct = (SourceLocation *)0x0;
  local_18->kind = OMPC_uses_allocators;
  local_18->clause_position = -1;
  (local_18->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->expressionNodes).super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->expressionNodes).super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->expressionNodes).super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->locations).super__Vector_base<SourceLocation,_std::allocator<SourceLocation>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->locations).super__Vector_base<SourceLocation,_std::allocator<SourceLocation>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->locations).super__Vector_base<SourceLocation,_std::allocator<SourceLocation>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_18->_vptr_OpenMPClause = (_func_int **)&PTR_toString_abi_cxx11__001b98f8;
  local_18[1]._vptr_OpenMPClause = (_func_int **)0x0;
  local_18[1].super_SourceLocation.line = 0;
  local_18[1].super_SourceLocation.column = 0;
  local_18[1].super_SourceLocation.parent_construct = (SourceLocation *)0x0;
  __position._M_current = *(OpenMPClause ***)(this + 8);
  if (__position._M_current == *(OpenMPClause ***)(this + 0x10)) {
    std::vector<OpenMPClause*,std::allocator<OpenMPClause*>>::_M_realloc_insert<OpenMPClause*const&>
              (this,__position,(OpenMPClause **)&local_18);
  }
  else {
    *__position._M_current = local_18;
    *(long *)(this + 8) = *(long *)(this + 8) + 8;
  }
  return local_18;
}

Assistant:

OpenMPClause* OpenMPUsesAllocatorsClause::addUsesAllocatorsClause(OpenMPDirective *directive) {
    std::map<OpenMPClauseKind, std::vector<OpenMPClause*>* >* all_clauses = directive->getAllClauses();
    std::vector<OpenMPClause*>* current_clauses = directive->getClauses(OMPC_uses_allocators);
    OpenMPClause* new_clause = NULL;
    if (current_clauses->size() == 0) {
        current_clauses = new std::vector<OpenMPClause *>();
        (*all_clauses)[OMPC_uses_allocators] = current_clauses;
    };
    new_clause = new OpenMPUsesAllocatorsClause();
    current_clauses->push_back(new_clause);

    return new_clause;
}